

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.h
# Opt level: O1

void xemmai::t_finalizes<xemmai::t_derives<xemmai::t_code,_xemmai::t_type_of<xemmai::t_object>_>_>::
     f_do_finalize(t_object *a_this,t_scan a_scan)

{
  void *pvVar1;
  t_object *ptVar2;
  
  (*a_scan)(*(t_object **)a_this->v_data);
  std::
  _Rb_tree<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_code::t_variable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_code::t_variable>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_code::t_variable>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_code::t_variable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_code::t_variable>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_code::t_variable>_>_>
               *)&a_this[1].v_rank);
  pvVar1 = *(void **)&a_this[1].v_color;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,a_this[1].v_cyclic - (long)pvVar1);
  }
  ptVar2 = a_this[1].v_next;
  if (ptVar2 != (t_object *)0x0) {
    operator_delete(ptVar2,(long)a_this[1].v_scan - (long)ptVar2);
    return;
  }
  return;
}

Assistant:

void t_finalizes<T_base>::f_do_finalize(t_object* a_this, t_scan a_scan)
{
	using t = typename T_base::t_what;
	t_type_of<t>::f_do_scan(a_this, a_scan);
	a_this->f_as<t>().~t();
}